

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.hpp
# Opt level: O0

optional<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*> __thiscall
unodb::detail::impl_helpers::
remove_or_choose_subtree<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>,unodb::detail::inode_256<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>>
          (impl_helpers *this,
          inode_256<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
          *inode,byte key_byte,basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_> k,
          db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
          *db_instance,node_ptr *node_in_parent)

{
  art_key_type k_00;
  node_type nVar1;
  bool bVar2;
  byte *args_1;
  basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::node_header>
  *this_00;
  header_type *ptr;
  undefined7 in_register_00000011;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 uVar3;
  find_result fVar4;
  optional<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*> oVar5;
  void *local_b8;
  void *local_b0;
  basic_node_ptr<unodb::detail::node_header> local_a8;
  undefined1 local_a0 [8];
  db_inode_unique_ptr<unodb::detail::inode_48<std::span<const_std::byte>,_std::span<const_std::byte>_>_>
  new_node;
  basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::node_header> *leaf;
  basic_node_ptr<unodb::detail::node_header> local_70;
  basic_node_ptr<unodb::detail::node_header> child_ptr_val;
  type *child_ptr;
  type *child_i;
  in_fake_critical_section<unodb::detail::basic_node_ptr<unodb::detail::node_header>_> *local_50;
  db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  *local_48;
  node_ptr *node_in_parent_local;
  db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  *db_instance_local;
  basic_inode_256<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
  *pbStack_30;
  byte key_byte_local;
  inode_256<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  *inode_local;
  basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_> k_local;
  undefined1 local_10;
  
  inode_local = (inode_256<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
                 *)CONCAT71(in_register_00000011,key_byte);
  node_in_parent_local = k.field_0._8_8_;
  k_local.field_0.key._M_ptr = (pointer)k.field_0._0_8_;
  db_instance_local._7_1_ = (byte)inode;
  local_48 = db_instance;
  pbStack_30 = (basic_inode_256<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
                *)this;
  fVar4 = basic_inode_256<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
          ::find_child((basic_inode_256<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
                        *)this,db_instance_local._7_1_);
  local_50 = fVar4.second;
  child_i._0_1_ = fVar4.first;
  args_1 = std::
           get<0ul,unsigned_char,unodb::in_fake_critical_section<unodb::detail::basic_node_ptr<unodb::detail::node_header>>*>
                     ((pair<unsigned_char,_unodb::in_fake_critical_section<unodb::detail::basic_node_ptr<unodb::detail::node_header>_>_*>
                       *)&child_i);
  child_ptr_val.tagged_ptr =
       (uintptr_t)
       std::
       get<1ul,unsigned_char,unodb::in_fake_critical_section<unodb::detail::basic_node_ptr<unodb::detail::node_header>>*>
                 ((pair<unsigned_char,_unodb::in_fake_critical_section<unodb::detail::basic_node_ptr<unodb::detail::node_header>_>_*>
                   *)&child_i);
  if (*(type *)child_ptr_val.tagged_ptr == (type)0x0) {
    std::optional<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*>::optional
              ((optional<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*> *)
               &k_local.field_0.key._M_extent);
    uVar3 = extraout_RDX;
  }
  else {
    local_70 = in_fake_critical_section<unodb::detail::basic_node_ptr<unodb::detail::node_header>_>
               ::load(*(in_fake_critical_section<unodb::detail::basic_node_ptr<unodb::detail::node_header>_>
                        **)child_ptr_val.tagged_ptr);
    nVar1 = basic_node_ptr<unodb::detail::node_header>::type(&local_70);
    if (nVar1 == LEAF) {
      this_00 = basic_node_ptr<unodb::detail::node_header>::
                ptr<unodb::detail::basic_leaf<std::span<std::byte_const,18446744073709551615ul>,unodb::detail::node_header>*>
                          (&local_70);
      new_node._M_t.
      super___uniq_ptr_impl<unodb::detail::inode_48<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_48<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_unodb::detail::inode_48<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_*,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_48<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
      .
      super__Head_base<0UL,_unodb::detail::inode_48<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_*,_false>
      ._M_head_impl =
           (inode_48<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
            *)inode_local;
      k_00.field_0.key._M_extent._M_extent_value =
           (__extent_storage<18446744073709551615UL>)
           (__extent_storage<18446744073709551615UL>)k_local.field_0.key._M_ptr;
      k_00.field_0.key._M_ptr = (pointer)inode_local;
      bVar2 = basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::node_header>
              ::matches(this_00,k_00);
      if (bVar2) {
        bVar2 = basic_inode<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>,_49U,_256U,_(unodb::node_type)4,_unodb::detail::inode_48<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::fake_inode,_unodb::detail::inode_256<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                ::is_min_size(&pbStack_30->
                               super_basic_inode_256_parent<unodb::detail::basic_art_policy<std::span<const_std::byte>,_std::span<const_std::byte>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
                             );
        if (bVar2) {
          basic_inode<unodb::detail::basic_art_policy<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>,unodb::db,unodb::in_fake_critical_section,unodb::fake_lock,unodb::fake_read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::node_header>,unodb::detail::inode_defs,unodb::detail::db_inode_deleter,unodb::detail::basic_db_leaf_deleter>,17u,48u,(unodb::node_type)3,unodb::detail::inode_16<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>,unodb::detail::inode_256<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>,unodb::detail::inode_48<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>>
          ::
          create<unodb::detail::inode_256<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>&,unsigned_char_const&>
                    ((basic_inode<unodb::detail::basic_art_policy<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>,unodb::db,unodb::in_fake_critical_section,unodb::fake_lock,unodb::fake_read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::node_header>,unodb::detail::inode_defs,unodb::detail::db_inode_deleter,unodb::detail::basic_db_leaf_deleter>,17u,48u,(unodb::node_type)3,unodb::detail::inode_16<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>,unodb::detail::inode_256<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>,unodb::detail::inode_48<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>>
                      *)local_a0,(db_type *)node_in_parent_local,
                     (inode_256<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
                      *)pbStack_30,args_1);
          ptr = (header_type *)
                std::
                unique_ptr<unodb::detail::inode_48<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_48<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                ::release((unique_ptr<unodb::detail::inode_48<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_48<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                           *)local_a0);
          basic_node_ptr<unodb::detail::node_header>::basic_node_ptr(&local_a8,ptr,I48);
          (local_48->root).tagged_ptr = local_a8.tagged_ptr;
          std::
          unique_ptr<unodb::detail::inode_48<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_48<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
          ::~unique_ptr((unique_ptr<unodb::detail::inode_48<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_48<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                         *)local_a0);
          db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
          ::account_shrinking_inode<(unodb::node_type)4>
                    ((db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
                      *)node_in_parent_local);
          local_b0 = (void *)0x0;
          std::optional<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*>::
          optional<std::nullptr_t,_true>
                    ((optional<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*> *)
                     &k_local.field_0.key._M_extent,&local_b0);
          uVar3 = extraout_RDX_02;
        }
        else {
          basic_inode_256<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
          ::remove(pbStack_30,(char *)(ulong)*args_1);
          local_b8 = (void *)0x0;
          std::optional<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*>::
          optional<std::nullptr_t,_true>
                    ((optional<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*> *)
                     &k_local.field_0.key._M_extent,&local_b8);
          uVar3 = extraout_RDX_03;
        }
      }
      else {
        std::optional<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*>::optional
                  ((optional<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*> *)
                   &k_local.field_0.key._M_extent);
        uVar3 = extraout_RDX_01;
      }
    }
    else {
      leaf = (basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::node_header>
              *)unwrap_fake_critical_section
                          (*(in_fake_critical_section<unodb::detail::basic_node_ptr<unodb::detail::node_header>_>
                             **)child_ptr_val.tagged_ptr);
      std::optional<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*>::
      optional<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*,_true>
                ((optional<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*> *)
                 &k_local.field_0.key._M_extent,(basic_node_ptr<unodb::detail::node_header> **)&leaf
                );
      uVar3 = extraout_RDX_00;
    }
  }
  oVar5.
  super__Optional_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*,_true,_true>.
  _M_payload.
  super__Optional_payload_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*>._9_7_ =
       (undefined7)((ulong)uVar3 >> 8);
  oVar5.
  super__Optional_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*,_true,_true>.
  _M_payload.
  super__Optional_payload_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*>.
  _M_engaged = (bool)local_10;
  oVar5.
  super__Optional_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*,_true,_true>.
  _M_payload.
  super__Optional_payload_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*>.
  _M_payload = (_Storage<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*,_true>)
               k_local.field_0.key._M_extent._M_extent_value;
  return (optional<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*>)
         oVar5.
         super__Optional_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*,_true,_true>
         ._M_payload.
         super__Optional_payload_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*>;
}

Assistant:

std::optional<detail::node_ptr*> impl_helpers::remove_or_choose_subtree(
    INode& inode, std::byte key_byte, basic_art_key<Key> k,
    db<Key, Value>& db_instance, detail::node_ptr* node_in_parent) {
  const auto [child_i, child_ptr]{inode.find_child(key_byte)};

  if (child_ptr == nullptr) return {};

  const auto child_ptr_val{child_ptr->load()};
  if (child_ptr_val.type() != node_type::LEAF)
    return unwrap_fake_critical_section(child_ptr);

  const auto* const leaf{
      child_ptr_val.template ptr<typename db<Key, Value>::leaf_type*>()};
  if (!leaf->matches(k)) return {};

  if (UNODB_DETAIL_UNLIKELY(inode.is_min_size())) {
    if constexpr (std::is_same_v<INode, inode_4<Key, Value>>) {
      auto current_node{art_policy<Key, Value>::make_db_inode_unique_ptr(
          &inode, db_instance)};
      *node_in_parent = current_node->leave_last_child(child_i, db_instance);
    } else {
      auto new_node{
          INode::smaller_derived_type::create(db_instance, inode, child_i)};
      *node_in_parent =
          node_ptr{new_node.release(), INode::smaller_derived_type::type};
    }
#ifdef UNODB_DETAIL_WITH_STATS
    db_instance.template account_shrinking_inode<INode::type>();
#endif  // UNODB_DETAIL_WITH_STATS
    return nullptr;
  }

  inode.remove(child_i, db_instance);
  return nullptr;
}